

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_ext_pre_shared_key_parse_serverhello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint8_t uVar1;
  int iVar2;
  undefined8 in_RAX;
  uint16_t psk_id;
  uint16_t local_12;
  
  local_12 = (uint16_t)((ulong)in_RAX >> 0x30);
  iVar2 = CBS_get_u16(contents,&local_12);
  if ((iVar2 == 0) || (contents->len != 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x798);
    uVar1 = '2';
  }
  else {
    if (local_12 == 0) {
      return true;
    }
    ERR_put_error(0x10,0,0xc3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x79f);
    uVar1 = 's';
  }
  *out_alert = uVar1;
  return false;
}

Assistant:

bool ssl_ext_pre_shared_key_parse_serverhello(SSL_HANDSHAKE *hs,
                                              uint8_t *out_alert,
                                              CBS *contents) {
  uint16_t psk_id;
  if (!CBS_get_u16(contents, &psk_id) ||  //
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // We only advertise one PSK identity, so the only legal index is zero.
  if (psk_id != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PSK_IDENTITY_NOT_FOUND);
    *out_alert = SSL_AD_UNKNOWN_PSK_IDENTITY;
    return false;
  }

  return true;
}